

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>::Keyboard::Keyboard
          (Keyboard *this,Processor *m6502)

{
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_48;
  
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl._0_8_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  Inputs::Keyboard::Keyboard
            (&this->super_Keyboard,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&local_48);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree(&local_48);
  (this->super_Keyboard)._vptr_Keyboard = (_func_int **)&PTR__Keyboard_0059a5f8;
  (this->string_serialiser_)._M_t.
  super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>.
  _M_t.
  super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
  .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl = (StringSerialiser *)0x0;
  this->open_apple_is_pressed = false;
  this->closed_apple_is_pressed = false;
  this->keyboard_input_ = '\0';
  this->key_is_down_ = false;
  this->last_pressed_character_ = '\0';
  this->character_is_pressed_ = false;
  this->repeat_is_pressed_ = false;
  this->shift_is_pressed_ = false;
  this->control_is_pressed_ = false;
  this->m6502_ = m6502;
  return;
}

Assistant:

Keyboard(Processor *m6502) : m6502_(m6502) {}